

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeT2STRDPreInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  DecodeStatus DVar4;
  uint uVar5;
  uint16_t *Decoder_01;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t Address_03;
  uint64_t uVar6;
  uint RegNo;
  DecodeStatus DVar7;
  uint RegNo_00;
  uint RegNo_01;
  void *Decoder_00;
  
  RegNo = Insn >> 0xc & 0xf;
  RegNo_01 = Insn >> 8 & 0xf;
  RegNo_00 = Insn >> 0x10 & 0xf;
  uVar5 = (RegNo_00 != RegNo_01) + 1 + (uint)(RegNo_00 != RegNo_01);
  Decoder_00 = (void *)(ulong)uVar5;
  Address_00 = 1;
  if (RegNo_00 != RegNo) {
    Address_00 = (uint64_t)uVar5;
  }
  uVar6 = 3;
  if ((Insn & 0x1200000) != 0x1000000) {
    uVar6 = Address_00;
  }
  DVar2 = DecoderGPRRegisterClass(Inst,RegNo_00,Address_00,Decoder_00);
  if (DVar2 == MCDisassembler_Fail) {
    bVar1 = false;
    DVar4 = DVar2;
  }
  else {
    bVar1 = true;
    DVar4 = (DecodeStatus)uVar6;
    if ((DVar2 != MCDisassembler_Success) && (DVar4 = DVar2, DVar2 != MCDisassembler_SoftFail)) {
      bVar1 = false;
      DVar4 = (DecodeStatus)uVar6;
    }
  }
  DVar2 = MCDisassembler_Fail;
  if (bVar1) {
    DVar3 = DecoderGPRRegisterClass(Inst,RegNo,Address_01,Decoder_00);
    if (DVar3 == MCDisassembler_Fail) {
      bVar1 = false;
      DVar7 = DVar3;
    }
    else {
      bVar1 = true;
      DVar7 = DVar4;
      if ((DVar3 != MCDisassembler_Success) && (DVar7 = DVar3, DVar3 != MCDisassembler_SoftFail)) {
        bVar1 = false;
        DVar7 = DVar4;
      }
    }
    if (bVar1) {
      DVar4 = DecoderGPRRegisterClass(Inst,RegNo_01,Address_02,Decoder_00);
      if (DVar4 == MCDisassembler_Fail) {
        bVar1 = false;
        DVar3 = DVar4;
      }
      else {
        bVar1 = true;
        DVar3 = DVar7;
        if ((DVar4 != MCDisassembler_Success) && (DVar3 = DVar4, DVar4 != MCDisassembler_SoftFail))
        {
          bVar1 = false;
          DVar3 = DVar7;
        }
      }
      if (bVar1) {
        Decoder_01 = GPRDecoderTable;
        MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[RegNo_00]);
        DecodeT2Imm8S4(Inst,Insn >> 0xf & 0x100 | Insn & 0xff,Address_03,Decoder_01);
        DVar2 = DVar3;
      }
    }
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeT2STRDPreInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Insn, 8, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned addr = fieldFromInstruction_4(Insn, 0, 8);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	bool writeback = (W == 1) | (P == 0);

	addr |= (U << 8) | (Rn << 9);

	if (writeback && (Rn == Rt || Rn == Rt2))
		Check(&S, MCDisassembler_SoftFail);

	// Writeback operand
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	// Rt
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	// Rt2
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	// addr
	if (!Check(&S, DecodeT2AddrModeImm8s4(Inst, addr, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}